

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::Arith3Inst::display(Arith3Inst *this,ostream *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar1;
  undefined8 extraout_RDX;
  
  display_op((this->super_Inst).op,o);
  display_cond((this->super_Inst).cond,o);
  std::operator<<(o," ");
  display_reg_name(o,this->rd);
  std::operator<<(o,", ");
  display_reg_name(o,this->r1);
  poVar1 = std::operator<<(o,", ");
  UNRECOVERED_JUMPTABLE = *(this->r2).super_Displayable._vptr_Displayable;
  (*UNRECOVERED_JUMPTABLE)(&this->r2,poVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void Arith3Inst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, rd);
  o << ", ";
  display_reg_name(o, r1);
  o << ", " << r2;
}